

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isPossibleVectorDigit(TokenKind kind)

{
  return (bool)((byte)(0x200000000124 >> ((byte)kind & 0x3f)) & kind < Hash);
}

Assistant:

bool SyntaxFacts::isPossibleVectorDigit(TokenKind kind) {
    switch (kind) {
        case TokenKind::IntegerLiteral:
        case TokenKind::Question:
        case TokenKind::RealLiteral:
        case TokenKind::Identifier:
            return true;
        default:
            return false;
    }
}